

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_query_exist_populated_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  char local_78;
  int iStack_74;
  ion_status_t status;
  ion_byte_t value [10];
  int key;
  ion_status_t status_1;
  int i;
  ion_byte_t test_value [10];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(test_value + 2));
  status_1.error = '\0';
  status_1._1_3_ = 0;
  while( true ) {
    if (99 < (int)status_1._0_4_) {
      value[2] = '\x18';
      value[3] = '\0';
      value[4] = '\0';
      value[5] = '\0';
      iVar2 = sl_get((ion_skiplist_t *)(test_value + 2),value + 2,&status.field_0x2);
      local_78 = iVar2.error;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(local_78 == '\0'),0x303,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      iStack_74 = iVar2.count;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iStack_74 == 1),0x304,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      pVar1 = planck_unit_assert_str_are_equal
                        (tc,&status.field_0x2,"Find 24",0x305,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                        );
      if (pVar1 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      sl_destroy((ion_skiplist_t *)(test_value + 2));
      return;
    }
    sprintf((char *)((long)&status_1.count + 2),"Find %d",(ulong)(uint)status_1._0_4_);
    register0x00000000 =
         sl_insert((ion_skiplist_t *)(test_value + 2),&status_1,
                   (ion_value_t)((long)&status_1.count + 2));
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(value[6] == '\0'),0x2f6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(key == 1),0x2f7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    status_1._0_4_ = status_1._0_4_ + 2;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_query_exist_populated_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t test_value[10];

	int i;

	for (i = 0; i < 100; i += 2) {
		sprintf((char *) test_value, "Find %d", i);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, test_value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	int			key		= 24;
	ion_byte_t	value[10];

	ion_status_t status = sl_get(&skiplist, (ion_key_t) &key, value);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, "Find 24");

	sl_destroy(&skiplist);
}